

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnNtk.c
# Opt level: O0

int Wln_NtkDupDfs_rec(Wln_Ntk_t *pNew,Wln_Ntk_t *p,int iObj)

{
  int iVar1;
  int local_28;
  int iFanin;
  int i;
  int iObj_local;
  Wln_Ntk_t *p_local;
  Wln_Ntk_t *pNew_local;
  
  if (iObj == 0) {
    pNew_local._4_4_ = 0;
  }
  else {
    iVar1 = Wln_ObjCopy(p,iObj);
    if (iVar1 == 0) {
      iVar1 = Wln_ObjIsFf(p,iObj);
      if (iVar1 != 0) {
        __assert_fail("!Wln_ObjIsFf(p, iObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wln/wlnNtk.c"
                      ,0x140,"int Wln_NtkDupDfs_rec(Wln_Ntk_t *, Wln_Ntk_t *, int)");
      }
      for (local_28 = 0; iVar1 = Wln_ObjFaninNum(p,iObj), local_28 < iVar1; local_28 = local_28 + 1)
      {
        iVar1 = Wln_ObjFanin(p,iObj,local_28);
        if (iVar1 != 0) {
          Wln_NtkDupDfs_rec(pNew,p,iVar1);
        }
      }
      pNew_local._4_4_ = Wln_ObjDup(pNew,p,iObj);
    }
    else {
      pNew_local._4_4_ = Wln_ObjCopy(p,iObj);
    }
  }
  return pNew_local._4_4_;
}

Assistant:

int Wln_NtkDupDfs_rec( Wln_Ntk_t * pNew, Wln_Ntk_t * p, int iObj )
{
    int i, iFanin;
    if ( iObj == 0 )
        return 0;
    if ( Wln_ObjCopy(p, iObj) )
        return Wln_ObjCopy(p, iObj);
    //printf( "Visiting node %16s (ID %6d) of type %5s (type ID %2d)\n", Wln_ObjName(p, iObj), iObj, Abc_OperName(Wln_ObjType(p, iObj)), Wln_ObjType(p, iObj) );
    assert( !Wln_ObjIsFf(p, iObj) );
    Wln_ObjForEachFanin( p, iObj, iFanin, i )
        Wln_NtkDupDfs_rec( pNew, p, iFanin );
    return Wln_ObjDup( pNew, p, iObj );
}